

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

const_buffer *
booster::aio::details::advance<booster::aio::const_buffer>(const_buffer *buf,size_t n)

{
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar1;
  ulong in_RDX;
  const_buffer *in_RDI;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar2;
  buffer_data_type data;
  const_buffer *res;
  buffer_impl<const_char_*> *in_stack_ffffffffffffffc0;
  entry *local_30;
  unsigned_long local_28;
  ulong local_18;
  
  const_buffer::const_buffer((const_buffer *)0x3896ca);
  pVar2 = buffer_impl<const_char_*>::get(in_stack_ffffffffffffffc0);
  local_18 = in_RDX;
  pVar1 = pVar2;
  while( true ) {
    local_28 = pVar1.second;
    local_30 = pVar1.first;
    if (local_28 == 0 || local_18 == 0) break;
    if (local_18 < local_30->size) {
      buffer_impl<const_char_*>::add(in_stack_ffffffffffffffc0,(char *)pVar2.first,pVar2.second);
      local_18 = 0;
    }
    else {
      local_18 = local_18 - local_30->size;
    }
    local_28 = local_28 - 1;
    local_30 = local_30 + 1;
    pVar1.second = local_28;
    pVar1.first = local_30;
  }
  while( true ) {
    local_28 = pVar1.second;
    local_30 = pVar1.first;
    if (local_28 == 0) break;
    buffer_impl<const_char_*>::add(in_stack_ffffffffffffffc0,(char *)pVar2.first,pVar2.second);
    pVar1.second = local_28 - 1;
    pVar1.first = local_30 + 1;
  }
  return in_RDI;
}

Assistant:

Buffer advance(Buffer const &buf,size_t n)
			{
				Buffer res;
				typename Buffer::buffer_data_type data=buf.get();
				while(data.second > 0 && n > 0) {
					if(data.first->size <= n) {
						n-= data.first->size;
						data.second--;
						data.first++;
					}
					else {
						res.add(data.first->ptr + n,data.first->size - n);
						n=0;
						data.second--;
						data.first++;
					}
				}
				while(data.second > 0) {
					res.add(data.first->ptr,data.first->size);
					data.second--;
					data.first++;
				}
				return res;
			}